

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChForce.cpp
# Opt level: O1

void __thiscall chrono::ChForce::ArchiveOUT(ChForce *this,ChArchiveOut *marchive)

{
  AlignmentFrame_mapper alignmapper;
  ReferenceFrame_mapper refmapper;
  ForceType_mapper ftypemapper;
  ChEnumMapper<chrono::ChForce::AlignmentFrame> local_c0;
  ChEnumMapper<chrono::ChForce::ReferenceFrame> local_a0;
  ChEnumMapper<chrono::ChForce::ForceType> local_80;
  ForceType_mapper local_60;
  char *local_40;
  ChEnumMapper<chrono::ChForce::AlignmentFrame> *local_38;
  undefined1 local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChForce>(marchive);
  ChObj::ArchiveOUT(&this->super_ChObj,marchive);
  ForceType_mapper::ForceType_mapper(&local_60);
  ForceType_mapper::operator()(&local_80,&local_60,&this->mode);
  local_a0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981a70;
  local_a0.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::ReferenceFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::ReferenceFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  local_a0.value_ptr = (ReferenceFrame *)&local_80;
  (*(marchive->super_ChArchive)._vptr_ChArchive[0xb])(marchive);
  local_80.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b2b910
  ;
  if (local_80.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::ForceType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::ForceType>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::ForceType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::ForceType>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  ReferenceFrame_mapper::ReferenceFrame_mapper((ReferenceFrame_mapper *)&local_80);
  ReferenceFrame_mapper::operator()(&local_a0,(ReferenceFrame_mapper *)&local_80,&this->frame);
  local_c0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981a7b;
  local_c0.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  local_c0.value_ptr = (AlignmentFrame *)&local_a0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[0xb])(marchive);
  local_a0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b2ba10
  ;
  if (local_a0.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::ReferenceFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::ReferenceFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::ReferenceFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::ReferenceFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  AlignmentFrame_mapper::AlignmentFrame_mapper((AlignmentFrame_mapper *)&local_a0);
  AlignmentFrame_mapper::operator()(&local_c0,(AlignmentFrame_mapper *)&local_a0,&this->align);
  local_40 = "alignment_frame_type";
  local_30 = 0;
  local_38 = &local_c0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[0xb])(marchive);
  local_c0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b2bb10
  ;
  if (local_c0.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_c0.value_ptr = (AlignmentFrame *)&this->vrelpoint;
  local_c0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981aa5;
  local_c0.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveOut::out<chrono::ChVector<double>>
            (marchive,(ChNameValue<chrono::ChVector<double>_> *)&local_c0);
  local_c0.value_ptr = (AlignmentFrame *)&this->vpoint;
  local_c0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981aaf;
  local_c0.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveOut::out<chrono::ChVector<double>>
            (marchive,(ChNameValue<chrono::ChVector<double>_> *)&local_c0);
  local_c0.value_ptr = (AlignmentFrame *)&this->move_x;
  local_c0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981ab6;
  local_c0.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveOut::out<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_c0);
  local_c0.value_ptr = (AlignmentFrame *)&this->move_y;
  local_c0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981abd;
  local_c0.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveOut::out<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_c0);
  local_c0.value_ptr = (AlignmentFrame *)&this->move_z;
  local_c0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981ac4;
  local_c0.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveOut::out<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_c0);
  local_c0.value_ptr = (AlignmentFrame *)&this->restpos;
  local_c0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981acb;
  local_c0.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveOut::out<chrono::ChVector<double>>
            (marchive,(ChNameValue<chrono::ChVector<double>_> *)&local_c0);
  local_c0.value_ptr = (AlignmentFrame *)&this->f_x;
  local_c0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981ad3;
  local_c0.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveOut::out<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_c0);
  local_c0.value_ptr = (AlignmentFrame *)&this->f_y;
  local_c0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981ad7;
  local_c0.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveOut::out<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_c0);
  local_c0.value_ptr = (AlignmentFrame *)&this->f_z;
  local_c0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981adb;
  local_c0.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveOut::out<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_c0);
  local_c0.value_ptr = (AlignmentFrame *)&this->mforce;
  local_c0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981adf;
  local_c0.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive);
  local_c0.value_ptr = (AlignmentFrame *)&this->modula;
  local_c0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981ae6;
  local_c0.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveOut::out<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_c0);
  local_c0.value_ptr = (AlignmentFrame *)&this->vreldir;
  local_c0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981aed;
  local_c0.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveOut::out<chrono::ChVector<double>>
            (marchive,(ChNameValue<chrono::ChVector<double>_> *)&local_c0);
  local_c0.value_ptr = (AlignmentFrame *)&this->vdir;
  local_c0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x981af5;
  local_c0.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::AlignmentFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveOut::out<chrono::ChVector<double>>
            (marchive,(ChNameValue<chrono::ChVector<double>_> *)&local_c0);
  local_a0.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b2bb10
  ;
  if (local_a0.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::ReferenceFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::ReferenceFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::ReferenceFrame>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::ReferenceFrame>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_80.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b2ba10
  ;
  if (local_80.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::ForceType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::ForceType>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::ForceType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::ForceType>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_60.super_ChEnumMapper<chrono::ChForce::ForceType>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b2b910;
  if (local_60.super_ChEnumMapper<chrono::ChForce::ForceType>.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::ForceType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::ForceType>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super_ChEnumMapper<chrono::ChForce::ForceType>.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChForce::ForceType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChForce::ForceType>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChForce::ArchiveOUT(ChArchiveOut& marchive) {
    // class version number
    marchive.VersionWrite<ChForce>();

    // serialize parent class too
    ChObj::ArchiveOUT(marchive);

    // stream out all member data

    ForceType_mapper ftypemapper;
    marchive << CHNVP(ftypemapper(mode), "force_type");
    ReferenceFrame_mapper refmapper;
    marchive << CHNVP(refmapper(frame), "reference_frame_type");
    AlignmentFrame_mapper alignmapper;
    marchive << CHNVP(alignmapper(align), "alignment_frame_type");

    marchive << CHNVP(vrelpoint);
    marchive << CHNVP(vpoint);
    marchive << CHNVP(move_x);
    marchive << CHNVP(move_y);
    marchive << CHNVP(move_z);
    marchive << CHNVP(restpos);
    marchive << CHNVP(f_x);
    marchive << CHNVP(f_y);
    marchive << CHNVP(f_z);
    marchive << CHNVP(mforce);
    marchive << CHNVP(modula, "f_time");
    marchive << CHNVP(vreldir);
    marchive << CHNVP(vdir);
}